

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_coder.c
# Opt level: O3

lzma_ret lzma_simple_coder_init
                   (lzma_next_coder *next,lzma_allocator *allocator,lzma_filter_info *filters,
                   _func_size_t_void_ptr_uint32_t__Bool_uint8_t_ptr_size_t *filter,
                   size_t simple_size,size_t unfiltered_max,uint32_t alignment,_Bool is_encoder)

{
  uint uVar1;
  lzma_ret lVar2;
  lzma_next_coder *next_00;
  void *pvVar3;
  
  next_00 = (lzma_next_coder *)next->coder;
  if (next_00 == (lzma_next_coder *)0x0) {
    next_00 = (lzma_next_coder *)lzma_alloc(unfiltered_max * 2 + 0x88,allocator);
    if (next_00 == (lzma_next_coder *)0x0) {
      return LZMA_MEM_ERROR;
    }
    next->coder = next_00;
    next->code = simple_code;
    next->end = simple_coder_end;
    next->update = simple_coder_update;
    next_00->coder = (void *)0x0;
    next_00->id = 0xffffffffffffffff;
    next_00->init = 0;
    next_00->code = (lzma_code_function)0x0;
    next_00->end = (lzma_end_function)0x0;
    next_00->get_progress = (_func_void_void_ptr_uint64_t_ptr_uint64_t_ptr *)0x0;
    next_00->get_check = (_func_lzma_check_void_ptr *)0x0;
    next_00->memconfig = (_func_lzma_ret_void_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t *)0x0;
    next_00->update =
         (_func_lzma_ret_void_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr *)0x0;
    next_00[1].id = (lzma_vli)filter;
    next_00[1].end = (lzma_end_function)(unfiltered_max * 2);
    if (simple_size == 0) {
      next_00[1].init = 0;
    }
    else {
      pvVar3 = lzma_alloc(simple_size,allocator);
      next_00[1].init = (uintptr_t)pvVar3;
      if (pvVar3 == (void *)0x0) {
        return LZMA_MEM_ERROR;
      }
    }
  }
  if ((uint *)filters->options == (uint *)0x0) {
    *(undefined4 *)&next_00[1].code = 0;
  }
  else {
    uVar1 = *filters->options;
    *(uint *)&next_00[1].code = uVar1;
    if ((uVar1 & alignment - 1) != 0) {
      return LZMA_OPTIONS_ERROR;
    }
  }
  *(_Bool *)((long)&next_00[1].coder + 1) = is_encoder;
  *(undefined1 *)&next_00[1].coder = 0;
  next_00[1].get_progress = (_func_void_void_ptr_uint64_t_ptr_uint64_t_ptr *)0x0;
  next_00[1].get_check = (_func_lzma_check_void_ptr *)0x0;
  next_00[1].memconfig = (_func_lzma_ret_void_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t *)0x0;
  lVar2 = lzma_next_filter_init(next_00,allocator,filters + 1);
  return lVar2;
}

Assistant:

extern lzma_ret
lzma_simple_coder_init(lzma_next_coder *next, const lzma_allocator *allocator,
		const lzma_filter_info *filters,
		size_t (*filter)(void *simple, uint32_t now_pos,
			bool is_encoder, uint8_t *buffer, size_t size),
		size_t simple_size, size_t unfiltered_max,
		uint32_t alignment, bool is_encoder)
{
	// Allocate memory for the lzma_simple_coder structure if needed.
	lzma_simple_coder *coder = next->coder;
	if (coder == NULL) {
		// Here we allocate space also for the temporary buffer. We
		// need twice the size of unfiltered_max, because then it
		// is always possible to filter at least unfiltered_max bytes
		// more data in coder->buffer[] if it can be filled completely.
		coder = lzma_alloc(sizeof(lzma_simple_coder)
				+ 2 * unfiltered_max, allocator);
		if (coder == NULL)
			return LZMA_MEM_ERROR;

		next->coder = coder;
		next->code = &simple_code;
		next->end = &simple_coder_end;
		next->update = &simple_coder_update;

		coder->next = LZMA_NEXT_CODER_INIT;
		coder->filter = filter;
		coder->allocated = 2 * unfiltered_max;

		// Allocate memory for filter-specific data structure.
		if (simple_size > 0) {
			coder->simple = lzma_alloc(simple_size, allocator);
			if (coder->simple == NULL)
				return LZMA_MEM_ERROR;
		} else {
			coder->simple = NULL;
		}
	}

	if (filters[0].options != NULL) {
		const lzma_options_bcj *simple = filters[0].options;
		coder->now_pos = simple->start_offset;
		if (coder->now_pos & (alignment - 1))
			return LZMA_OPTIONS_ERROR;
	} else {
		coder->now_pos = 0;
	}

	// Reset variables.
	coder->is_encoder = is_encoder;
	coder->end_was_reached = false;
	coder->pos = 0;
	coder->filtered = 0;
	coder->size = 0;

	return lzma_next_filter_init(&coder->next, allocator, filters + 1);
}